

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O0

int divide_look_behind_alternatives(Node *node)

{
  int iVar1;
  AnchorNode *an;
  Node *insert_node;
  Node *np;
  Node *head;
  int anc_type;
  int r;
  Node *node_local;
  
  head._0_4_ = (node->u).cclass.bs[1];
  np = (node->u).base.body;
  insert_node = (np->u).base.body;
  _anc_type = node;
  node_swap(node,np);
  (_anc_type->u).base.body = np;
  (np->u).base.body = insert_node;
  insert_node = _anc_type;
  while( true ) {
    insert_node = (insert_node->u).cons.cdr;
    if (insert_node == (_Node *)0x0) {
      if ((Bits)head == 8) {
        insert_node = _anc_type;
        do {
          (insert_node->u).base.node_type = ND_LIST;
          insert_node = (insert_node->u).cons.cdr;
        } while (insert_node != (_Node *)0x0);
      }
      return 0;
    }
    iVar1 = onig_node_copy((Node **)&an,np);
    if (iVar1 != 0) break;
    if (an == (AnchorNode *)0x0) {
      return -5;
    }
    an->body = (insert_node->u).base.body;
    (insert_node->u).base.body = (_Node *)an;
    head._4_4_ = 0;
  }
  return iVar1;
}

Assistant:

static int
divide_look_behind_alternatives(Node* node)
{
  int r;
  int anc_type;
  Node *head, *np, *insert_node;
  AnchorNode* an;

  an = ANCHOR_(node);
  anc_type = an->type;

  head = ND_ANCHOR_BODY(an);
  np = ND_CAR(head);
  node_swap(node, head);
  ND_CAR(node) = head;
  ND_BODY(head) = np;

  np = node;
  while (IS_NOT_NULL(np = ND_CDR(np))) {
    r = onig_node_copy(&insert_node, head);
    if (r != 0) return r;
    CHECK_NULL_RETURN_MEMERR(insert_node);
    ND_BODY(insert_node) = ND_CAR(np);
    ND_CAR(np) = insert_node;
  }

  if (anc_type == ANCR_LOOK_BEHIND_NOT) {
    np = node;
    do {
      ND_SET_TYPE(np, ND_LIST);  /* alt -> list */
    } while (IS_NOT_NULL(np = ND_CDR(np)));
  }
  return 0;
}